

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.h
# Opt level: O3

void __thiscall CSTORCommand::CSTORCommand(CSTORCommand *this)

{
  (this->super_CCommand).m_Command._M_dataplus._M_p =
       (pointer)&(this->super_CCommand).m_Command.field_2;
  (this->super_CCommand).m_Command._M_string_length = 0;
  (this->super_CCommand).m_Command.field_2._M_local_buf[0] = '\0';
  (this->super_CCommand).m_Args._M_dataplus._M_p = (pointer)&(this->super_CCommand).m_Args.field_2;
  (this->super_CCommand).m_Args._M_string_length = 0;
  (this->super_CCommand).m_Args.field_2._M_local_buf[0] = '\0';
  (this->super_CCommand)._vptr_CCommand = (_func_int **)&PTR_MatchCommand_0012b878;
  std::__cxx11::string::_M_replace((ulong)&(this->super_CCommand).m_Command,0,(char *)0x0,0x11f900);
  return;
}

Assistant:

CSTORCommand(){m_Command = "STOR";}